

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

gc_heap_ptr<mjs::array_object> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::array_object,mjs::gc_heap_ptr<mjs::global_object>const&,mjs::string,mjs::gc_heap_ptr<mjs::object>&,unsigned_int&>
          (gc_heap *this,size_t num_bytes,gc_heap_ptr<mjs::global_object> *args,string *args_1,
          gc_heap_ptr<mjs::object> *args_2,uint *args_3)

{
  slot_allocation_header *psVar1;
  char *pcVar2;
  undefined8 extraout_RDX;
  allocation_result aVar3;
  gc_heap_ptr<mjs::array_object> gVar4;
  uint *in_stack_00000008;
  undefined1 local_48 [8];
  allocation_result a;
  gc_heap_ptr<mjs::object> *args_local_2;
  string *args_local_1;
  gc_heap_ptr<mjs::global_object> *args_local;
  size_t num_bytes_local;
  gc_heap *this_local;
  
  a.obj = (slot *)args_3;
  aVar3 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  a._0_8_ = aVar3.obj;
  local_48._0_4_ = aVar3.pos;
  psVar1 = allocation_result::hdr((allocation_result *)local_48);
  if (psVar1->type == 0xffffffff) {
    pcVar2 = (char *)a._0_8_;
    gc_type_info_registration<mjs::array_object>::
    construct<mjs::gc_heap_ptr<mjs::global_object>const&,mjs::string,mjs::gc_heap_ptr<mjs::object>&,unsigned_int&>
              ((void *)a._0_8_,(gc_heap_ptr<mjs::global_object> *)args_1,(string *)args_2,
               (gc_heap_ptr<mjs::object> *)&(a.obj)->allocation,in_stack_00000008);
    pcVar2 = gc_type_info_registration<mjs::array_object>::index(pcVar2,(int)args_1);
    psVar1 = allocation_result::hdr((allocation_result *)local_48);
    psVar1->type = (uint32_t)pcVar2;
    gc_heap_ptr<mjs::array_object>::gc_heap_ptr
              ((gc_heap_ptr<mjs::array_object> *)this,(gc_heap *)num_bytes,local_48._0_4_);
    gVar4.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar4.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::array_object>)gVar4.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::array_object, Args = <const mjs::gc_heap_ptr<mjs::global_object> &, mjs::string, mjs::gc_heap_ptr<mjs::object> &, unsigned int &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}